

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetInputRecordTest_Test::TestBody(Psbt_SetInputRecordTest_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  reference pvVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint *puVar9;
  size_type sVar10;
  char *pcVar11;
  reference pvVar12;
  char *in_R9;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  ByteData get_gval2;
  ByteData get_gval1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ByteData global_value2;
  ByteData global_key2;
  ByteData global_value1;
  ByteData global_key1;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  Transaction get_tx2;
  Transaction get_tx1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  KeyData get_val2;
  KeyData get_val1;
  Psbt psbt2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  AssertionResult gtest_ar;
  CfdException *except;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_val_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_key_bytes;
  KeyData key2;
  KeyData key1;
  string path2;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  string *in_stack_ffffffffffffe9f8;
  KeyData *in_stack_ffffffffffffea00;
  undefined7 in_stack_ffffffffffffea08;
  undefined1 in_stack_ffffffffffffea0f;
  allocator_type *in_stack_ffffffffffffea10;
  undefined7 in_stack_ffffffffffffea18;
  undefined1 in_stack_ffffffffffffea1f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffea20;
  undefined7 in_stack_ffffffffffffeab8;
  Psbt *in_stack_ffffffffffffeac0;
  AssertHelper local_1430;
  Message local_1428;
  string local_1420;
  AssertionResult local_1400;
  AssertHelper local_13f0;
  Message local_13e8;
  string local_13e0;
  string local_13c0;
  AssertionResult local_13a0;
  AssertHelper local_1390;
  Message local_1388;
  string local_1380;
  string local_1360;
  AssertionResult local_1340;
  AssertHelper local_1330;
  Message local_1328;
  size_type local_1320;
  undefined4 local_1314;
  AssertionResult local_1310;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1300;
  AssertHelper local_12e8;
  Message local_12e0;
  string local_12d8;
  string local_12b8;
  AssertionResult local_1298;
  AssertHelper local_1288;
  Message local_1280;
  string local_1278;
  string local_1258;
  AssertionResult local_1238;
  ByteData local_1228;
  ByteData local_1210;
  ByteData local_11f8 [6];
  string local_1160;
  AssertHelper local_1140;
  Message local_1138;
  undefined1 local_1129;
  AssertionResult local_1128;
  string local_1118;
  AssertHelper local_10f8;
  Message local_10f0;
  byte local_10e1;
  AssertionResult local_10e0;
  string local_10d0;
  AssertHelper local_10b0;
  Message local_10a8;
  undefined1 local_1099;
  AssertionResult local_1098;
  allocator local_1081;
  string local_1080;
  ByteData local_1060;
  allocator local_1041;
  string local_1040;
  allocator local_1019;
  string local_1018;
  ByteData local_ff8;
  allocator local_fd9;
  string local_fd8;
  ByteData local_fb8;
  allocator local_f99;
  string local_f98;
  allocator local_f71;
  string local_f70;
  ByteData local_f50;
  AssertHelper local_f38;
  Message local_f30;
  string local_f28;
  AssertionResult local_f08;
  AssertHelper local_ef8;
  Message local_ef0;
  string local_ee8;
  AssertionResult local_ec8;
  Transaction local_eb8;
  Transaction local_e78;
  AssertHelper local_e38;
  Message local_e30;
  string local_e28;
  string local_e08;
  AssertionResult local_de8;
  AssertHelper local_dd8;
  Message local_dd0;
  string local_dc8;
  string local_da8;
  AssertionResult local_d88;
  KeyData local_d78;
  KeyData local_bf0;
  ByteData local_a68;
  Psbt local_a50;
  AssertHelper local_9d0;
  Message local_9c8;
  string local_9c0;
  AssertionResult local_9a0;
  AssertHelper local_990;
  Message local_988;
  ByteData local_980;
  string local_968;
  AssertionResult local_948 [3];
  Transaction local_910;
  ByteData local_8d0;
  allocator local_8b1;
  string local_8b0;
  ByteData local_890;
  allocator local_871;
  string local_870;
  ByteData local_850;
  allocator local_831;
  string local_830;
  ByteData local_810 [2];
  allocator local_7c9;
  string local_7c8;
  ByteData local_7a8;
  allocator local_789;
  string local_788;
  ByteData local_768;
  allocator local_749;
  string local_748;
  ByteData local_728;
  allocator local_709;
  string local_708;
  ByteData local_6e8;
  Transaction local_6d0;
  ByteData local_690;
  allocator local_671;
  string local_670;
  ByteData local_650;
  ByteData local_638;
  ByteData local_620;
  ByteData local_608;
  ByteData local_5f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5c0;
  ByteData local_5a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_590;
  ByteData local_578;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_560;
  Pubkey local_548;
  ByteData local_530;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_518;
  Pubkey local_500;
  ByteData local_4e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_498;
  KeyData local_480;
  KeyData local_2f8;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  ByteData local_120;
  HDWallet local_108;
  ByteData local_f0;
  HDWallet local_d8;
  allocator local_a9;
  string local_a8 [32];
  Psbt local_88;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,&local_a9);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::core::ByteData::ByteData(&local_f0,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_d8,&local_f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b59ad);
  cfd::core::ByteData::ByteData(&local_120,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_108,&local_120);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b59e7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"44h/0h/0h/1/1",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"44h/0h/0h/0/1",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cfd::core::HDWallet::GeneratePubkeyData(&local_2f8,&local_d8,kTestnet,&local_140,kNormal);
  cfd::core::HDWallet::GeneratePubkeyData(&local_480,&local_108,kTestnet,&local_168,kNormal);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2b5aca);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffea20,CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18)
             ,in_stack_ffffffffffffea10);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2b5af3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5b00);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_498,0);
  *pvVar6 = '\x06';
  cfd::core::KeyData::GetPubkey(&local_500,&local_2f8);
  cfd::core::Pubkey::GetData(&local_4e8,&local_500);
  cfd::core::ByteData::GetBytes(&local_4d0,&local_4e8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5b66);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b5b73);
  cfd::core::KeyData::GetPubkey(&local_548,&local_480);
  cfd::core::Pubkey::GetData(&local_530,&local_548);
  cfd::core::ByteData::GetBytes(&local_518,&local_530);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5bc5);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b5bd2);
  cfd::core::KeyData::GetFingerprint(&local_578,&local_2f8);
  cfd::core::ByteData::GetBytes(&local_560,&local_578);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5c0d);
  cfd::core::KeyData::GetFingerprint(&local_5a8,&local_480);
  cfd::core::ByteData::GetBytes(&local_590,&local_5a8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5c48);
  cfd::core::KeyData::GetChildNumArray(&local_5c0,&local_2f8);
  cfd::core::KeyData::GetChildNumArray(&local_5d8,&local_480);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_498,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5c9d);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_5c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffea20,CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5cf5);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5d0a);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5d26);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2b5d47);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_5c0);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_5f0,&local_498);
  cfd::core::ByteData::ByteData(&local_608,&local_4b8);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_498,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5dcd);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_5d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffea20,CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5e25);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5e3a);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b5e56);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2b5e77);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_5d8);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_620,&local_498);
  cfd::core::ByteData::ByteData(&local_638,&local_4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_670,"00",&local_671);
  cfd::core::ByteData::ByteData(&local_650,&local_670);
  cfd::core::Transaction::Transaction(&local_6d0,&g_psbt_utxo_witness_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData(&local_690,&local_6d0.super_AbstractTransaction);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_650,&local_690);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5f7b);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffea00);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5f95);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_708,"01",&local_709);
  cfd::core::ByteData::ByteData(&local_6e8,&local_708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_748,"00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"
             ,&local_749);
  cfd::core::ByteData::ByteData(&local_728,&local_748);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_6e8,&local_728);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b6071);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b6098);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_788,"03",&local_789);
  cfd::core::ByteData::ByteData(&local_768,&local_788);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c8,"01000000",&local_7c9);
  cfd::core::ByteData::ByteData(&local_7a8,&local_7c8);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_768,&local_7a8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b6174);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b619b);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_830,"04",&local_831);
  cfd::core::ByteData::ByteData(local_810,&local_830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_870,"0014962c4e08f336d3afbc3415c9d359ae1040470520",&local_871);
  cfd::core::ByteData::ByteData(&local_850,&local_870);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,local_810,&local_850);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b698e);
  std::__cxx11::string::~string((string *)&local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b69b5);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_5f0,&local_608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8b0,"00",&local_8b1);
  cfd::core::ByteData::ByteData(&local_890,&local_8b0);
  cfd::core::Transaction::Transaction(&local_910,&g_psbt_utxo_legacy_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData(&local_8d0,&local_910.super_AbstractTransaction);
  cfd::core::Psbt::SetTxInRecord(&local_88,1,&local_890,&local_8d0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b6a98);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffea00);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b6ab2);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  cfd::core::Psbt::SetTxInRecord(&local_88,1,&local_620,&local_638);
  cfd::core::Psbt::GetData(&local_980,&local_88);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_968,&local_980);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_948,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_968);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b6ec8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(local_948);
  if (!bVar4) {
    testing::Message::Message(&local_988);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b6f8a);
    testing::internal::AssertHelper::AssertHelper
              (&local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x574,pcVar11);
    testing::internal::AssertHelper::operator=(&local_990,&local_988);
    testing::internal::AssertHelper::~AssertHelper(&local_990);
    testing::Message::~Message((Message *)0x2b6fed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b7045);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_9c0,&local_88);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_9a0,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_9c0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_9a0);
  if (!bVar4) {
    testing::Message::Message(&local_9c8);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b7132);
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x575,pcVar11);
    testing::internal::AssertHelper::operator=(&local_9d0,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    testing::Message::~Message((Message *)0x2b7195);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b71ed);
  cfd::core::Psbt::GetData(&local_a68,&local_88);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffea00,(ByteData *)in_stack_ffffffffffffe9f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b7228);
  cfd::core::Psbt::GetTxInKeyData(&local_bf0,&local_a50,0,false);
  cfd::core::Psbt::GetTxInKeyData(&local_d78,&local_a50,1,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_da8,&local_bf0,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_dc8,&local_2f8,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
             (char *)in_stack_ffffffffffffea10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffea00);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_da8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_d88);
  if (!bVar4) {
    testing::Message::Message(&local_dd0);
    in_stack_ffffffffffffeac0 =
         (Psbt *)testing::AssertionResult::failure_message((AssertionResult *)0x2b7418);
    testing::internal::AssertHelper::AssertHelper
              (&local_dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x57a,(char *)in_stack_ffffffffffffeac0);
    testing::internal::AssertHelper::operator=(&local_dd8,&local_dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_dd8);
    testing::Message::~Message((Message *)0x2b747b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b74d3);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_e08,&local_d78,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_e28,&local_480,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
             (char *)in_stack_ffffffffffffea10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffea00);
  std::__cxx11::string::~string((string *)&local_e28);
  std::__cxx11::string::~string((string *)&local_e08);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_de8);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_e30);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b7616);
    testing::internal::AssertHelper::AssertHelper
              (&local_e38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x57b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e38,&local_e30);
    testing::internal::AssertHelper::~AssertHelper(&local_e38);
    testing::Message::~Message((Message *)0x2b7679);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b76d1);
  cfd::core::Psbt::GetTxInUtxoFull(&local_e78,&local_a50,0,false,(bool *)0x0);
  cfd::core::Psbt::GetTxInUtxoFull(&local_eb8,&local_a50,1,false,(bool *)0x0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_ee8,&local_e78.super_AbstractTransaction)
  ;
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
             (char *)in_stack_ffffffffffffea10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffea00);
  std::__cxx11::string::~string((string *)&local_ee8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_ec8);
  if (!bVar4) {
    testing::Message::Message(&local_ef0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b782a);
    testing::internal::AssertHelper::AssertHelper
              (&local_ef8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x57f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_ef8,&local_ef0);
    testing::internal::AssertHelper::~AssertHelper(&local_ef8);
    testing::Message::~Message((Message *)0x2b788d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b78e5);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_f28,&local_eb8.super_AbstractTransaction)
  ;
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
             (char *)in_stack_ffffffffffffea10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffea00);
  std::__cxx11::string::~string((string *)&local_f28);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_f08);
  if (!bVar4) {
    testing::Message::Message(&local_f30);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b79ca);
    testing::internal::AssertHelper::AssertHelper
              (&local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x580,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f38,&local_f30);
    testing::internal::AssertHelper::~AssertHelper(&local_f38);
    testing::Message::~Message((Message *)0x2b7a2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b7a85);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f70,"cfd",&local_f71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f98,"dummy1",&local_f99);
  cfd::core::Psbt::CreateRecordKey(&local_f50,0xfc,&local_f70,'\0',&local_f98);
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  std::__cxx11::string::~string((string *)&local_f70);
  std::allocator<char>::~allocator((allocator<char> *)&local_f71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fd8,"01020304",&local_fd9);
  cfd::core::ByteData::ByteData(&local_fb8,&local_fd8);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1018,"cfd",&local_1019);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1040,"dummy2",&local_1041);
  cfd::core::Psbt::CreateRecordKey(&local_ff8,0xfc,&local_1018,'\0',&local_1040);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator((allocator<char> *)&local_1019);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1080,"00",&local_1081);
  cfd::core::ByteData::ByteData(&local_1060,&local_1080);
  std::__cxx11::string::~string((string *)&local_1080);
  std::allocator<char>::~allocator((allocator<char> *)&local_1081);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_f50,&local_fb8);
  local_1099 = cfd::core::Psbt::IsFindTxInRecord(&local_88,0,&local_f50);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffea00,(bool *)in_stack_ffffffffffffe9f8,
             (type *)0x2b7d1f);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1098);
  if (!bVar4) {
    testing::Message::Message(&local_10a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_10d0,(internal *)&local_1098,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x587,pcVar11);
    testing::internal::AssertHelper::operator=(&local_10b0,&local_10a8);
    testing::internal::AssertHelper::~AssertHelper(&local_10b0);
    std::__cxx11::string::~string((string *)&local_10d0);
    testing::Message::~Message((Message *)0x2b7fb7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b802f);
  bVar4 = cfd::core::Psbt::IsFindTxInRecord(&local_88,0,&local_ff8);
  local_10e1 = ~bVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffea00,(bool *)in_stack_ffffffffffffe9f8,
             (type *)0x2b8074);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_10e0);
  if (!bVar4) {
    testing::Message::Message(&local_10f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1118,(internal *)&local_10e0,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x588,pcVar11);
    testing::internal::AssertHelper::operator=(&local_10f8,&local_10f0);
    testing::internal::AssertHelper::~AssertHelper(&local_10f8);
    std::__cxx11::string::~string((string *)&local_1118);
    testing::Message::~Message((Message *)0x2b816c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b81e7);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_ff8,&local_1060);
  local_1129 = cfd::core::Psbt::IsFindTxInRecord(&local_88,0,&local_ff8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffea00,(bool *)in_stack_ffffffffffffe9f8,
             (type *)0x2b824b);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1128);
  if (!bVar4) {
    testing::Message::Message(&local_1138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1160,(internal *)&local_1128,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x58a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1140,&local_1138);
    testing::internal::AssertHelper::~AssertHelper(&local_1140);
    std::__cxx11::string::~string((string *)&local_1160);
    testing::Message::~Message((Message *)0x2b8343);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b83be);
  cfd::core::Psbt::GetData(local_11f8,&local_88);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffea00,(ByteData *)in_stack_ffffffffffffe9f8);
  cfd::Psbt::operator=(in_stack_ffffffffffffeac0,(Psbt *)CONCAT17(uVar5,in_stack_ffffffffffffeab8));
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffea00);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b841d);
  cfd::core::Psbt::GetTxInRecord(&local_1210,&local_a50,0,&local_f50);
  cfd::core::Psbt::GetTxInRecord(&local_1228,&local_a50,0,&local_ff8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1258,&local_1210);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1278,&local_fb8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
             (char *)in_stack_ffffffffffffea10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffea00);
  std::__cxx11::string::~string((string *)&local_1278);
  std::__cxx11::string::~string((string *)&local_1258);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1238);
  if (!bVar4) {
    testing::Message::Message(&local_1280);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b8604);
    testing::internal::AssertHelper::AssertHelper
              (&local_1288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x58f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1288,&local_1280);
    testing::internal::AssertHelper::~AssertHelper(&local_1288);
    testing::Message::~Message((Message *)0x2b8661);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b86b9);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_12b8,&local_1228);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_12d8,&local_1060);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
             (char *)in_stack_ffffffffffffea10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffea00);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::__cxx11::string::~string((string *)&local_12b8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1298);
  if (!bVar4) {
    testing::Message::Message(&local_12e0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b87e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_12e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x590,pcVar11);
    testing::internal::AssertHelper::operator=(&local_12e8,&local_12e0);
    testing::internal::AssertHelper::~AssertHelper(&local_12e8);
    testing::Message::~Message((Message *)0x2b883d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b8895);
  cfd::core::Psbt::GetTxInRecordKeyList(&local_1300,&local_a50,0);
  local_1314 = 2;
  local_1320 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1300);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
             (char *)in_stack_ffffffffffffea10,
             (int *)CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
             (unsigned_long *)in_stack_ffffffffffffea00);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1310);
  if (!bVar4) {
    testing::Message::Message(&local_1328);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b897d);
    testing::internal::AssertHelper::AssertHelper
              (&local_1330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x593,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1330,&local_1328);
    testing::internal::AssertHelper::~AssertHelper(&local_1330);
    testing::Message::~Message((Message *)0x2b89da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b8a32);
  sVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1300)
  ;
  if (sVar10 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1360,&local_f50);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&local_1300,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1380,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
               (char *)in_stack_ffffffffffffea10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea00);
    std::__cxx11::string::~string((string *)&local_1380);
    std::__cxx11::string::~string((string *)&local_1360);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1340);
    if (!bVar4) {
      testing::Message::Message(&local_1388);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b8b7c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x595,pcVar11);
      testing::internal::AssertHelper::operator=(&local_1390,&local_1388);
      testing::internal::AssertHelper::~AssertHelper(&local_1390);
      testing::Message::~Message((Message *)0x2b8bd9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b8c31);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_13c0,&local_ff8);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&local_1300,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_13e0,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
               (char *)in_stack_ffffffffffffea10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea00);
    std::__cxx11::string::~string((string *)&local_13e0);
    std::__cxx11::string::~string((string *)&local_13c0);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_13a0);
    if (!bVar4) {
      testing::Message::Message(&local_13e8);
      in_stack_ffffffffffffea10 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x2b8d65);
      testing::internal::AssertHelper::AssertHelper
                (&local_13f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x596,(char *)in_stack_ffffffffffffea10);
      testing::internal::AssertHelper::operator=(&local_13f0,&local_13e8);
      testing::internal::AssertHelper::~AssertHelper(&local_13f0);
      testing::Message::~Message((Message *)0x2b8dc2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b8e17);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_1420,&local_a50);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1400,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_1420);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1400);
  if (!bVar4) {
    testing::Message::Message(&local_1428);
    in_stack_ffffffffffffea00 =
         (KeyData *)testing::AssertionResult::failure_message((AssertionResult *)0x2b8f00);
    testing::internal::AssertHelper::AssertHelper
              (&local_1430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x598,(char *)in_stack_ffffffffffffea00);
    testing::internal::AssertHelper::operator=(&local_1430,&local_1428);
    testing::internal::AssertHelper::~AssertHelper(&local_1430);
    testing::Message::~Message((Message *)0x2b8f5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b8fb5);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_ffffffffffffea10);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b8fcf);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b8fdc);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b8fe9);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b8ff6);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b9003);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b9010);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffea00);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffea00);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffea00);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffea00);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffea00);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b905e);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b906b);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b9078);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b9085);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffea10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffea10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffea10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffea10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffea10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffea10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffea10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffea10);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffea00);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffea00);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2b912e);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2b913b);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffea00);
  return;
}

Assistant:

TEST(Psbt, SetInputRecordTest) {
  Psbt psbt("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/1";
  std::string path2 = "44h/0h/0h/0/1";

  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);

  std::vector<uint8_t> txin_key_bytes(34);
  std::vector<uint8_t> txin_val_bytes;
  txin_key_bytes[0] = 6;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txin_key_bytes[1], pk_bytes1.data(), 33);
  txin_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txin_val_bytes.data(), fp1.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txin_key_bytes);
  ByteData txout_value1 = ByteData(txin_val_bytes);

  memcpy(&txin_key_bytes[1], pk_bytes2.data(), 33);
  txin_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txin_val_bytes.data(), fp2.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txin_key_bytes);
  ByteData txout_value2 = ByteData(txin_val_bytes);

  psbt.SetTxInRecord(0, ByteData("00"), Transaction(g_psbt_utxo_witness).GetData());
  try {
    psbt.SetTxInRecord(0, ByteData("01"), ByteData("00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"));
    psbt.SetTxInRecord(0, ByteData("03"), ByteData("01000000"));
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  psbt.SetTxInRecord(0, ByteData("04"), ByteData("0014962c4e08f336d3afbc3415c9d359ae1040470520"));
  psbt.SetTxInRecord(0, txout_key1, txout_value1);

  try {
    psbt.SetTxInRecord(1, ByteData("00"), Transaction(g_psbt_utxo_legacy).GetData());
    psbt.SetTxInRecord(1, txout_key2, txout_value2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxInKeyData(0);
  auto get_val2 = psbt2.GetTxInKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  auto get_tx1 = psbt2.GetTxInUtxoFull(0);
  auto get_tx2 = psbt2.GetTxInUtxoFull(1);
  EXPECT_EQ(get_tx1.GetHex(), g_psbt_utxo_witness);
  EXPECT_EQ(get_tx2.GetHex(), g_psbt_utxo_legacy);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxInRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxInRecord(0, global_key2));
  psbt.SetTxInRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxInRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxInRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxInRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA", psbt2.GetBase64().c_str());
}